

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-ls.c
# Opt level: O1

void listbigfile_r(BigFile *bf,char *path)

{
  dirent *__ptr;
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  char *__dest;
  long lVar5;
  undefined8 uStack_e0;
  char acStack_d8 [8];
  undefined1 local_d0 [8];
  stat st;
  dirent **local_38;
  dirent **namelist;
  
  pcVar4 = bf->basename;
  uStack_e0 = 0x1024ab;
  sVar2 = strlen(pcVar4);
  uStack_e0 = 0x1024b6;
  sVar3 = strlen(path);
  lVar5 = -(sVar2 + sVar3 + 0x19 & 0xfffffffffffffff0);
  __dest = acStack_d8 + lVar5;
  if (sVar3 == 0) {
    *(undefined8 *)((long)&uStack_e0 + lVar5) = 0x1024f4;
    strcpy(__dest,pcVar4);
  }
  else {
    *(undefined8 *)((long)&uStack_e0 + lVar5) = 0x1024e7;
    sprintf(__dest,"%s/%s",pcVar4,path);
  }
  *(undefined8 *)((long)&uStack_e0 + lVar5) = 0x102506;
  stat(__dest,(stat *)local_d0);
  if (((uint)st.st_nlink & 0xf000) == 0x4000) {
    *(undefined8 *)((long)&uStack_e0 + lVar5) = 0x102535;
    uVar1 = scandir(__dest,&local_38,filter,alphasort);
    if ((int)uVar1 < 0) {
      *(undefined8 *)((long)&uStack_e0 + lVar5) = 0x102609;
      fprintf(_stderr,"cannot open dir: %s\n",__dest);
    }
    else {
      if (uVar1 != 0) {
        st.__glibc_reserved[2] = (__syscall_slong_t)uVar1;
        lVar5 = 0;
        do {
          pcVar4 = local_38[lVar5]->d_name;
          builtin_strncpy(__dest + -8,"`%\x10",4);
          __dest[-4] = '\0';
          __dest[-3] = '\0';
          __dest[-2] = '\0';
          __dest[-1] = '\0';
          sVar2 = strlen(pcVar4);
          builtin_strncpy(__dest + -8,"k%\x10",4);
          __dest[-4] = '\0';
          __dest[-3] = '\0';
          __dest[-2] = '\0';
          __dest[-1] = '\0';
          sVar3 = strlen(path);
          __dest = __dest + -(sVar3 + sVar2 + 0x19 & 0xfffffffffffffff0);
          if (sVar3 == 0) {
            __dest[-8] = -0x5a;
            __dest[-7] = '%';
            __dest[-6] = '\x10';
            __dest[-5] = '\0';
            __dest[-4] = '\0';
            __dest[-3] = '\0';
            __dest[-2] = '\0';
            __dest[-1] = '\0';
            strcpy(__dest,pcVar4);
          }
          else {
            __dest[-8] = -100;
            __dest[-7] = '%';
            __dest[-6] = '\x10';
            __dest[-5] = '\0';
            __dest[-4] = '\0';
            __dest[-3] = '\0';
            __dest[-2] = '\0';
            __dest[-1] = '\0';
            sprintf(__dest,"%s/%s",path,pcVar4);
          }
          __dest[-8] = -0x4f;
          __dest[-7] = '%';
          __dest[-6] = '\x10';
          __dest[-5] = '\0';
          __dest[-4] = '\0';
          __dest[-3] = '\0';
          __dest[-2] = '\0';
          __dest[-1] = '\0';
          listbigblock(bf,__dest);
          __dest[-8] = -0x44;
          __dest[-7] = '%';
          __dest[-6] = '\x10';
          __dest[-5] = '\0';
          __dest[-4] = '\0';
          __dest[-3] = '\0';
          __dest[-2] = '\0';
          __dest[-1] = '\0';
          listbigfile_r(bf,__dest);
          __ptr = local_38[lVar5];
          __dest[-8] = -0x37;
          __dest[-7] = '%';
          __dest[-6] = '\x10';
          __dest[-5] = '\0';
          __dest[-4] = '\0';
          __dest[-3] = '\0';
          __dest[-2] = '\0';
          __dest[-1] = '\0';
          free(__ptr);
          lVar5 = lVar5 + 1;
        } while (st.__glibc_reserved[2] != lVar5);
      }
      __dest[-8] = -0x21;
      __dest[-7] = '%';
      __dest[-6] = '\x10';
      __dest[-5] = '\0';
      __dest[-4] = '\0';
      __dest[-3] = '\0';
      __dest[-2] = '\0';
      __dest[-1] = '\0';
      free(local_38);
    }
  }
  return;
}

Assistant:

static void listbigfile_r(BigFile * bf, char * path) {
    struct dirent **namelist;
    struct stat st;
    int n;
    char * buf = alloca(strlen(bf->basename) + strlen(path) + 10);
    if(strlen(path) > 0) 
        sprintf(buf, "%s/%s", bf->basename, path);
    else
        sprintf(buf, "%s", bf->basename);
    stat(buf, &st);
    if(!S_ISDIR(st.st_mode)) return;
    n = scandir(buf, &namelist, filter, alphasort);
    if (n < 0) {
        fprintf(stderr, "cannot open dir: %s\n", buf);
    } else {
        int i;
        for(i = 0; i < n ; i ++) {
            char * blockname = alloca(strlen(namelist[i]->d_name) + strlen(path) + 10);
            if(strlen(path) > 0) 
                sprintf(blockname, "%s/%s", path, namelist[i]->d_name);
            else
                sprintf(blockname, "%s", namelist[i]->d_name);
            listbigblock(bf, blockname);
            listbigfile_r(bf, blockname);
            free(namelist[i]);
        }
        free(namelist);
    }
}